

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DP.c
# Opt level: O0

void pnga_copy_patch_dp(char *t_a,Integer g_a,Integer ailo,Integer aihi,Integer ajlo,Integer ajhi,
                       Integer g_b,Integer bilo,Integer bihi,Integer bjlo,Integer bjhi)

{
  char cVar1;
  logical lVar2;
  void *pvVar3;
  long lVar4;
  long in_RCX;
  long in_RDX;
  Integer in_RSI;
  char *in_RDI;
  long in_R8;
  long in_R9;
  long in_stack_00000010;
  long in_stack_00000018;
  Integer dims [2];
  Integer ndim;
  DoublePrecision *dbl_ptrB;
  DoublePrecision *dbl_ptrA;
  char *in_stack_00000050;
  char transp;
  Integer ldT;
  Integer hi [2];
  Integer lo [2];
  Integer j;
  Integer i;
  Integer ld;
  Integer me;
  Integer nelem;
  Integer corr;
  Integer jhid;
  Integer jlod;
  Integer ihid;
  Integer ilod;
  Integer jhis;
  Integer jlos;
  Integer ihis;
  Integer ilos;
  Integer bdim2;
  Integer bdim1;
  Integer adim2;
  Integer adim1;
  Integer btype;
  Integer atype;
  Integer *in_stack_000001b8;
  Integer *in_stack_000001c0;
  Integer in_stack_000001c8;
  Integer in_stack_000001d0;
  Integer *in_stack_00000290;
  void *in_stack_00000298;
  Integer *in_stack_000002a0;
  Integer *in_stack_000002a8;
  Integer in_stack_000002b0;
  Integer *jhip;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 uVar5;
  Integer *in_stack_fffffffffffffec8;
  Integer in_stack_fffffffffffffed0;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d0;
  long local_c8;
  long local_c0;
  Integer local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  Integer local_60;
  Integer *local_58;
  Integer local_50;
  Integer *local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  Integer local_10;
  char *local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_b8 = pnga_nodeid();
  pnga_check_handle(corr,(char *)nelem);
  pnga_check_handle(corr,(char *)nelem);
  pnga_inquire(ilod,(Integer *)ihid,(Integer *)jlod,(Integer *)jhid);
  local_50 = in_stack_fffffffffffffed0;
  local_48 = in_stack_fffffffffffffec8;
  pnga_inquire(ilod,(Integer *)ihid,(Integer *)jlod,(Integer *)jhid);
  local_60 = in_stack_fffffffffffffed0;
  local_58 = in_stack_fffffffffffffec8;
  if ((local_38 != local_40) || (local_38 != 0x3ec)) {
    pnga_error(in_stack_00000050,(Integer)dbl_ptrA);
  }
  if ((((local_18 < 1) || ((long)local_48 < local_20)) || (local_28 < 1)) || (local_50 < local_30))
  {
    pnga_error(in_stack_00000050,(Integer)dbl_ptrA);
  }
  if (((in_stack_00000010 < 1) || ((long)local_58 < in_stack_00000018)) ||
     ((dims[0] < 1 || (local_60 < dims[1])))) {
    pnga_error(in_stack_00000050,(Integer)dbl_ptrA);
  }
  if (((in_stack_00000018 - in_stack_00000010) + 1 != (local_20 - local_18) + 1) ||
     ((dims[1] - dims[0]) + 1 != (local_30 - local_28) + 1)) {
    pnga_error(in_stack_00000050,(Integer)dbl_ptrA);
  }
  uVar5 = true;
  if (*local_8 != 'n') {
    uVar5 = *local_8 == 'N';
  }
  cVar1 = 't';
  if ((bool)uVar5 != false) {
    cVar1 = 'n';
  }
  pnga_distribution(in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,in_stack_000001b8);
  local_68 = local_e8;
  local_78 = local_e0;
  local_70 = local_f8;
  local_80 = local_f0;
  jhip = &local_80;
  lVar2 = patch_intersect(local_18,local_20,local_28,local_30,&local_68,&local_70,&local_78,jhip);
  if (lVar2 != 0) {
    pnga_access_ptr(in_stack_000002b0,in_stack_000002a8,in_stack_000002a0,in_stack_00000298,
                    in_stack_00000290);
    local_b0 = ((local_70 - local_68) + 1) * ((local_80 - local_78) + 1);
    if (cVar1 == 'n') {
      local_88 = local_68 + (in_stack_00000010 - local_18);
      local_90 = local_70 + (in_stack_00000010 - local_18);
      local_a8 = dims[0] - local_28;
      local_98 = local_78 + local_a8;
      local_a0 = local_80 + local_a8;
    }
    else {
      pvVar3 = pnga_malloc(CONCAT17(uVar5,in_stack_fffffffffffffec0),in_stack_fffffffffffffebc,
                           (char *)jhip);
      lVar4 = (local_80 - local_78) + 1;
      for (local_d0 = 0; local_d0 < (local_80 - local_78) + 1; local_d0 = local_d0 + 1) {
        for (local_c8 = 0; local_c8 < (local_70 - local_68) + 1; local_c8 = local_c8 + 1) {
          *(undefined8 *)((long)pvVar3 + local_d0 * 8 + local_c8 * lVar4 * 8) =
               *(undefined8 *)(local_d0 * local_c0 * 8 + local_c8 * 8);
        }
      }
      pnga_release(local_10,&local_e8,&local_f8);
      local_88 = local_78 + (in_stack_00000010 - local_28);
      local_90 = local_80 + (in_stack_00000010 - local_28);
      local_a8 = dims[0] - local_18;
      local_98 = local_68 + local_a8;
      local_a0 = local_70 + local_a8;
      local_c0 = lVar4;
    }
    local_e8 = local_88;
    local_e0 = local_98;
    local_f8 = local_90;
    local_f0 = local_a0;
    pnga_put(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
             (Integer *)CONCAT17(uVar5,in_stack_fffffffffffffec0),
             (void *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),jhip);
    if (cVar1 == 't') {
      pnga_free((void *)0x25dd75);
    }
  }
  return;
}

Assistant:

void pnga_copy_patch_dp(t_a, g_a, ailo, aihi, ajlo, ajhi,
                   g_b, bilo, bihi, bjlo, bjhi)
     Integer g_a, ailo, aihi, ajlo, ajhi;
     Integer g_b, bilo, bihi, bjlo, bjhi;
     char *t_a;
{
Integer atype, btype, adim1, adim2, bdim1, bdim2;
Integer ilos, ihis, jlos, jhis;
Integer ilod, ihid, jlod, jhid, corr, nelem;
Integer me= pnga_nodeid(), ld, i,j;
Integer lo[2], hi[2];
Integer ldT;
char transp;
DoublePrecision *dbl_ptrA=NULL, *dbl_ptrB=NULL;
Integer ndim, dims[2];

   pnga_check_handle(g_a, "pnga_copy_patch_dp");
   pnga_check_handle(g_b, "pnga_copy_patch_dp");

   /* if(g_a == g_b) pnga_error("pnga_copy_patch_dp: arrays have to different ", 0L); */

   pnga_inquire(g_a, &atype, &ndim, dims);
   adim1 = dims[0];
   adim2 = dims[1];
   pnga_inquire(g_b, &btype, &ndim, dims);
   bdim1 = dims[0];
   bdim2 = dims[1];

   if(atype != btype || (atype != C_DBL ))
      pnga_error("pnga_copy_patch_dp: wrong types ", 0L);

   /* check if patch indices and dims match */
   if (ailo <= 0 || aihi > adim1 || ajlo <= 0 || ajhi > adim2)
       pnga_error(" pnga_copy_patch_dp: g_a indices out of range ", 0L);
   if (bilo <= 0 || bihi > bdim1 || bjlo <= 0 || bjhi > bdim2)
       pnga_error(" pnga_copy_patch_dp: g_b indices out of range ", 0L);

   /* check if numbers of elements in two patches match each other */
   if (((bihi - bilo + 1)  != (aihi - ailo + 1)) || 
      ( (bjhi - bjlo + 1)  != (ajhi - ajlo + 1)) )
       pnga_error(" pnga_copy_patch_dp: shapes two of patches do not match ", 0L);

    /* is transpose operation required ? */
   transp = (*t_a == 'n' || *t_a =='N')? 'n' : 't';

   /* now find out cordinates of a patch of g_a that I own */
   pnga_distribution(g_a, me, lo, hi);
   ilos = lo[0];
   jlos = lo[1];
   ihis = hi[0];
   jhis = hi[1];

   if(patch_intersect(ailo, aihi, ajlo, ajhi, &ilos, &ihis, &jlos, &jhis)){
      pnga_access_ptr(g_a, lo, hi, &dbl_ptrA, &ld);
      
      nelem = (ihis-ilos+1)*(jhis-jlos+1);
      
      if ( transp == 'n' ) {
	  corr  = bilo - ailo;
	  ilod  = ilos + corr; 
	  ihid  = ihis + corr;
	  corr  = bjlo - ajlo;
	  jlod  = jlos + corr; 
	  jhid  = jhis + corr;
      } else {
	/* If this is a transpose copy, we need local scratch space */
	dbl_ptrB = (DoublePrecision*) pnga_malloc(nelem,MT_F_DBL,"copypatch_dp");

	  /* Copy from the source into this local array, transposed */
	  ldT = jhis-jlos+1;
	  
	  for(j=0; j< jhis-jlos+1; j++)
	      for(i=0; i< ihis-ilos+1; i++)
		  *(dbl_ptrB + i*ldT + j) = *(dbl_ptrA + j*ld + i);

	  /* Now we can reset index to point to the transposed stuff */
      pnga_release(g_a, lo, hi);
	  dbl_ptrA = dbl_ptrB;
	  ld = ldT;

	  /* And finally, figure out what the destination indices are */
	  corr  = bilo - ajlo;
	  ilod  = jlos + corr; 
	  ihid  = jhis + corr;
	  corr  = bjlo - ailo;
	  jlod  = ilos + corr; 
	  jhid  = ihis + corr;
      }
	  
      /* Put it where it belongs */
      lo[0] = ilod;
      lo[1] = jlod;
      hi[0] = ihid;
      hi[1] = jhid;
      pnga_put(g_b, lo, hi, dbl_ptrA, &ld);

      /* Get rid of local memory if we used it */
      if( transp == 't') pnga_free(dbl_ptrB);
  }
}